

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::ValidateMessageOptions
          (DescriptorBuilder *this,Descriptor *message,DescriptorProto *proto)

{
  Rep *pRVar1;
  Arena *pAVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  FieldDescriptorProto *pFVar6;
  DescriptorProto *proto_00;
  EnumDescriptorProto *proto_01;
  MessageOptions *this_00;
  ExtensionRange *pEVar7;
  string *psVar8;
  DescriptorProto_ExtensionRange *pDVar9;
  long lVar10;
  long lVar11;
  SubstituteArg local_278;
  SubstituteArg local_248;
  SubstituteArg local_218;
  SubstituteArg local_1e8;
  SubstituteArg local_1b8;
  SubstituteArg local_188;
  SubstituteArg local_158;
  SubstituteArg local_128;
  SubstituteArg local_f8;
  SubstituteArg local_c8;
  allocator local_81;
  string local_80;
  string local_60;
  int local_3c;
  long lStack_38;
  int i_4;
  int64_t max_extension_range;
  int i_3;
  int i_2;
  int i_1;
  int i;
  DescriptorProto *proto_local;
  Descriptor *message_local;
  DescriptorBuilder *this_local;
  
  i_2 = 0;
  _i_1 = proto;
  proto_local = (DescriptorProto *)message;
  message_local = (Descriptor *)this;
  while( true ) {
    iVar5 = i_2;
    iVar4 = Descriptor::field_count((Descriptor *)proto_local);
    if (iVar4 <= iVar5) break;
    pRVar1 = (proto_local->field_).super_RepeatedPtrFieldBase.rep_;
    lVar10 = (long)i_2;
    pFVar6 = DescriptorProto::field(_i_1,i_2);
    ValidateFieldOptions(this,(FieldDescriptor *)(pRVar1->elements + lVar10 * 9 + -1),pFVar6);
    i_2 = i_2 + 1;
  }
  i_3 = 0;
  while( true ) {
    iVar5 = i_3;
    iVar4 = Descriptor::nested_type_count((Descriptor *)proto_local);
    if (iVar4 <= iVar5) break;
    lVar10 = *(long *)&(proto_local->nested_type_).super_RepeatedPtrFieldBase.current_size_;
    lVar11 = (long)i_3;
    proto_00 = DescriptorProto::nested_type(_i_1,i_3);
    ValidateMessageOptions(this,(Descriptor *)(lVar10 + lVar11 * 0x88),proto_00);
    i_3 = i_3 + 1;
  }
  max_extension_range._4_4_ = 0;
  while( true ) {
    iVar5 = max_extension_range._4_4_;
    iVar4 = Descriptor::enum_type_count((Descriptor *)proto_local);
    if (iVar4 <= iVar5) break;
    pRVar1 = (proto_local->nested_type_).super_RepeatedPtrFieldBase.rep_;
    lVar10 = (long)max_extension_range._4_4_;
    proto_01 = DescriptorProto::enum_type(_i_1,max_extension_range._4_4_);
    ValidateEnumOptions(this,(EnumDescriptor *)(pRVar1->elements + lVar10 * 9 + -1),proto_01);
    max_extension_range._4_4_ = max_extension_range._4_4_ + 1;
  }
  max_extension_range._0_4_ = 0;
  while( true ) {
    iVar5 = (int)max_extension_range;
    iVar4 = Descriptor::extension_count((Descriptor *)proto_local);
    if (iVar4 <= iVar5) break;
    lVar10 = *(long *)&(proto_local->enum_type_).super_RepeatedPtrFieldBase.current_size_;
    lVar11 = (long)(int)max_extension_range;
    pFVar6 = DescriptorProto::extension(_i_1,(int)max_extension_range);
    ValidateFieldOptions(this,(FieldDescriptor *)(lVar10 + lVar11 * 0x48),pFVar6);
    max_extension_range._0_4_ = (int)max_extension_range + 1;
  }
  this_00 = Descriptor::options((Descriptor *)proto_local);
  bVar3 = MessageOptions::message_set_wire_format(this_00);
  iVar4 = std::numeric_limits<int>::max();
  iVar5 = 0x1fffffff;
  if (bVar3) {
    iVar5 = iVar4;
  }
  lStack_38 = (long)iVar5;
  local_3c = 0;
  while( true ) {
    iVar5 = local_3c;
    iVar4 = Descriptor::extension_range_count((Descriptor *)proto_local);
    if (iVar4 <= iVar5) break;
    pEVar7 = Descriptor::extension_range((Descriptor *)proto_local,local_3c);
    if (lStack_38 + 1 < (long)pEVar7->end) {
      psVar8 = Descriptor::full_name_abi_cxx11_((Descriptor *)proto_local);
      pDVar9 = DescriptorProto::extension_range(_i_1,local_3c);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_80,"Extension numbers cannot be greater than $0.",&local_81);
      strings::internal::SubstituteArg::SubstituteArg(&local_c8,lStack_38);
      strings::internal::SubstituteArg::SubstituteArg(&local_f8);
      strings::internal::SubstituteArg::SubstituteArg(&local_128);
      strings::internal::SubstituteArg::SubstituteArg(&local_158);
      strings::internal::SubstituteArg::SubstituteArg(&local_188);
      strings::internal::SubstituteArg::SubstituteArg(&local_1b8);
      strings::internal::SubstituteArg::SubstituteArg(&local_1e8);
      strings::internal::SubstituteArg::SubstituteArg(&local_218);
      strings::internal::SubstituteArg::SubstituteArg(&local_248);
      strings::internal::SubstituteArg::SubstituteArg(&local_278);
      strings::Substitute(&local_60,&local_80,&local_c8,&local_f8,&local_128,&local_158,&local_188,
                          &local_1b8,&local_1e8,&local_218,&local_248,&local_278);
      AddError(this,psVar8,&pDVar9->super_Message,NUMBER,&local_60);
      std::__cxx11::string::~string((string *)&local_60);
      std::__cxx11::string::~string((string *)&local_80);
      std::allocator<char>::~allocator((allocator<char> *)&local_81);
    }
    psVar8 = Descriptor::full_name_abi_cxx11_((Descriptor *)proto_local);
    pAVar2 = (proto_local->enum_type_).super_RepeatedPtrFieldBase.arena_;
    lVar10 = (long)local_3c;
    pDVar9 = DescriptorProto::extension_range(_i_1,local_3c);
    ValidateExtensionRangeOptions(this,psVar8,(ExtensionRange *)(pAVar2 + lVar10 * 0x10),pDVar9);
    local_3c = local_3c + 1;
  }
  return;
}

Assistant:

void DescriptorBuilder::ValidateMessageOptions(Descriptor* message,
                                               const DescriptorProto& proto) {
  VALIDATE_OPTIONS_FROM_ARRAY(message, field, Field);
  VALIDATE_OPTIONS_FROM_ARRAY(message, nested_type, Message);
  VALIDATE_OPTIONS_FROM_ARRAY(message, enum_type, Enum);
  VALIDATE_OPTIONS_FROM_ARRAY(message, extension, Field);

  const int64_t max_extension_range =
      static_cast<int64_t>(message->options().message_set_wire_format()
                               ? std::numeric_limits<int32_t>::max()
                               : FieldDescriptor::kMaxNumber);
  for (int i = 0; i < message->extension_range_count(); ++i) {
    if (message->extension_range(i)->end > max_extension_range + 1) {
      AddError(message->full_name(), proto.extension_range(i),
               DescriptorPool::ErrorCollector::NUMBER,
               strings::Substitute("Extension numbers cannot be greater than $0.",
                                max_extension_range));
    }

    ValidateExtensionRangeOptions(message->full_name(),
                                  message->extension_ranges_ + i,
                                  proto.extension_range(i));
  }
}